

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandShowBdd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pObj;
  char *pcVar3;
  Abc_Ntk_t *local_60;
  Abc_Ntk_t *pTemp;
  uint local_40;
  int fGlobal;
  int fCompl;
  int c;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  local_40 = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"cgh"), iVar2 != -1) {
    if (iVar2 == 99) {
      local_40 = local_40 ^ 1;
    }
    else {
      if (iVar2 != 0x67) goto LAB_002648f6;
      bVar1 = (bool)(bVar1 ^ 1);
    }
  }
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Empty network.\n");
    pAbc_local._4_4_ = 1;
  }
  else if (bVar1) {
    iVar2 = Abc_NtkIsStrash(pNtk_00);
    local_60 = pNtk_00;
    if (iVar2 == 0) {
      local_60 = Abc_NtkStrash(pNtk_00,0,0,0);
    }
    Abc_NtkShowBdd(local_60,local_40);
    if (local_60 != pNtk_00) {
      Abc_NtkDelete(local_60);
    }
    pAbc_local._4_4_ = 0;
  }
  else {
    iVar2 = Abc_NtkIsBddLogic(pNtk_00);
    if (iVar2 == 0) {
      Abc_Print(-1,"Visualizing BDDs can only be done for logic BDD networks (run \"bdd\").\n");
      pAbc_local._4_4_ = 1;
    }
    else if (globalUtilOptind + 1 < argc) {
      Abc_Print(-1,"Wrong number of auguments.\n");
LAB_002648f6:
      Abc_Print(-2,"usage: show_bdd [-cgh] <node>\n");
      Abc_Print(-2,"       uses DOT and GSVIEW to visualize the global BDDs of primary outputs\n");
      Abc_Print(-2,
                "       in terms of primary inputs or the local BDD of a node in terms of its fanins\n"
               );
      Abc_Print(-2,
                "\t<node>: (optional) the node to consider [default = the driver of the first PO]\n"
               );
      pcVar3 = "no";
      if (local_40 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-c    : toggle visualizing BDD with complemented edges [default = %s].\n",
                pcVar3);
      pcVar3 = "no";
      if (bVar1) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,
                "\t-g    : toggle visualizing the global BDDs of primary outputs [default = %s].\n",
                pcVar3);
      Abc_Print(-2,"\t-h    : print the command usage\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if (argc == globalUtilOptind) {
        pObj = Abc_NtkPo(pNtk_00,0);
        _fCompl = Abc_ObjFanin0(pObj);
        iVar2 = Abc_ObjIsNode(_fCompl);
        if (iVar2 == 0) {
          pcVar3 = Abc_ObjName(_fCompl);
          Abc_Print(-1,"The driver \"%s\" of the first PO is not an internal node.\n",pcVar3);
          return 1;
        }
      }
      else {
        _fCompl = Abc_NtkFindNode(pNtk_00,argv[globalUtilOptind]);
        if (_fCompl == (Abc_Obj_t *)0x0) {
          Abc_Print(-1,"Cannot find node \"%s\".\n",argv[globalUtilOptind]);
          return 1;
        }
      }
      Abc_NodeShowBdd(_fCompl,local_40);
      pAbc_local._4_4_ = 0;
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandShowBdd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c, fCompl = 0, fGlobal = 0;
    extern void Abc_NodeShowBdd( Abc_Obj_t * pNode, int fCompl );
    extern void Abc_NtkShowBdd( Abc_Ntk_t * pNtk, int fCompl );

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cgh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fCompl ^= 1;
            break;
        case 'g':
            fGlobal ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fGlobal )
    {
        Abc_Ntk_t * pTemp = Abc_NtkIsStrash(pNtk) ? pNtk : Abc_NtkStrash(pNtk, 0, 0, 0);
        Abc_NtkShowBdd( pTemp, fCompl );
        if ( pTemp != pNtk )
            Abc_NtkDelete( pTemp );
        return 0;
    }

    if ( !Abc_NtkIsBddLogic(pNtk) )
    {
        Abc_Print( -1, "Visualizing BDDs can only be done for logic BDD networks (run \"bdd\").\n" );
        return 1;
    }
    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }
    if ( argc == globalUtilOptind )
    {
        pNode = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
        if ( !Abc_ObjIsNode(pNode) )
        {
            Abc_Print( -1, "The driver \"%s\" of the first PO is not an internal node.\n", Abc_ObjName(pNode) );
            return 1;
        }
    }
    else
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
    }
    Abc_NodeShowBdd( pNode, fCompl );
    return 0;

usage:
    Abc_Print( -2, "usage: show_bdd [-cgh] <node>\n" );
    Abc_Print( -2, "       uses DOT and GSVIEW to visualize the global BDDs of primary outputs\n" );
    Abc_Print( -2, "       in terms of primary inputs or the local BDD of a node in terms of its fanins\n" );
#ifdef WIN32
    Abc_Print( -2, "       \"dot.exe\" and \"gsview32.exe\" should be set in the paths\n" );
    Abc_Print( -2, "       (\"gsview32.exe\" may be in \"C:\\Program Files\\Ghostgum\\gsview\\\")\n" );
#endif
    Abc_Print( -2, "\t<node>: (optional) the node to consider [default = the driver of the first PO]\n");
    Abc_Print( -2, "\t-c    : toggle visualizing BDD with complemented edges [default = %s].\n", fCompl? "yes": "no" );
    Abc_Print( -2, "\t-g    : toggle visualizing the global BDDs of primary outputs [default = %s].\n", fGlobal? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}